

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

void exprnode_free(ExprNode *en)

{
  ExprNode **ptr;
  size_t i;
  ulong uVar1;
  
  switch(en->op) {
  case OP_AND:
  case OP_OR:
    for (uVar1 = 0; ptr = (en->field_2).field_0.subexprs, uVar1 < (en->field_2).field_0.nsubexprs;
        uVar1 = uVar1 + 1) {
      exprnode_free(ptr[uVar1]);
    }
    break;
  case OP_NOT:
    exprnode_free((ExprNode *)(en->field_2).field_0.subexprs);
    goto switchD_0015754b_caseD_4;
  case OP_HOSTNAME_WC:
    ptr = (en->field_2).field_0.subexprs;
    break;
  case OP_PORT_RANGE:
    goto switchD_0015754b_caseD_4;
  default:
    __assert_fail("false && \"unhandled node type in exprnode_free\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x148,"void exprnode_free(ExprNode *)");
  }
  safefree(ptr);
switchD_0015754b_caseD_4:
  safefree(en);
  return;
}

Assistant:

static void exprnode_free(ExprNode *en)
{
    switch (en->op) {
      case OP_AND:
      case OP_OR:
        for (size_t i = 0; i < en->nsubexprs; i++)
            exprnode_free(en->subexprs[i]);
        sfree(en->subexprs);
        break;
      case OP_NOT:
        exprnode_free(en->subexpr);
        break;
      case OP_HOSTNAME_WC:
        sfree(en->wc);
        break;
      case OP_PORT_RANGE:
        break;
      default:
        unreachable("unhandled node type in exprnode_free");
    }

    sfree(en);
}